

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::BVH::query(BVH *this,AABB *queryAabb,Array<unsigned_int> *result)

{
  Array<xatlas::internal::BVH::Node> *this_00;
  Array<xatlas::internal::AABB> *this_01;
  bool bVar1;
  uint uVar2;
  Node *pNVar3;
  uint *puVar4;
  AABB *other;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t o;
  uint uVar8;
  uint32_t todo [64];
  uint32_t local_138 [66];
  
  (result->m_base).size = 0;
  local_138[0] = 0;
  this_00 = &this->m_nodes;
  uVar5 = 0;
  while (-1 < (int)uVar5) {
    uVar2 = uVar5 - 1;
    uVar6 = local_138[uVar5];
    pNVar3 = Array<xatlas::internal::BVH::Node>::operator[](this_00,uVar6);
    uVar7 = pNVar3->rightOffset;
    if (uVar7 == 0) {
      for (uVar8 = 0; uVar5 = uVar2, uVar8 < pNVar3->nPrims; uVar8 = uVar8 + 1) {
        uVar6 = pNVar3->start + uVar8;
        this_01 = this->m_objectAabbs;
        puVar4 = Array<unsigned_int>::operator[](&this->m_objectIds,uVar6);
        other = Array<xatlas::internal::AABB>::operator[](this_01,*puVar4);
        bVar1 = AABB::intersect(queryAabb,other);
        if (bVar1) {
          puVar4 = Array<unsigned_int>::operator[](&this->m_objectIds,uVar6);
          ArrayBase::push_back(&result->m_base,(uint8_t *)puVar4);
        }
      }
    }
    else {
      pNVar3 = Array<xatlas::internal::BVH::Node>::operator[](this_00,uVar6 + 1);
      bVar1 = AABB::intersect(queryAabb,&pNVar3->aabb);
      if (bVar1) {
        local_138[uVar5] = uVar6 + 1;
        uVar2 = uVar5;
      }
      uVar7 = uVar7 + uVar6;
      pNVar3 = Array<xatlas::internal::BVH::Node>::operator[](this_00,uVar7);
      bVar1 = AABB::intersect(queryAabb,&pNVar3->aabb);
      uVar5 = uVar2;
      if (bVar1) {
        local_138[uVar2 + 1] = uVar7;
        uVar5 = uVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void query(const AABB &queryAabb, Array<uint32_t> &result) const
	{
		result.clear();
		// Working set
		uint32_t todo[64];
		int32_t stackptr = 0;
		// "Push" on the root node to the working set
		todo[stackptr] = 0;
		while(stackptr >= 0) {
			// Pop off the next node to work on.
			const int ni = todo[stackptr--];
			const Node &node = m_nodes[ni];
			// Is leaf -> Intersect
			if (node.rightOffset == 0) {
				for(uint32_t o = 0; o < node.nPrims; ++o) {
					const uint32_t obj = node.start + o;
					if (queryAabb.intersect((*m_objectAabbs)[m_objectIds[obj]]))
						result.push_back(m_objectIds[obj]);
				}
			} else { // Not a leaf
				const uint32_t left = ni + 1;
				const uint32_t right = ni + node.rightOffset;
				if (queryAabb.intersect(m_nodes[left].aabb))
					todo[++stackptr] = left;
				if (queryAabb.intersect(m_nodes[right].aabb))
					todo[++stackptr] = right;
			}
		}
	}